

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::push_front(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
             *this,size_type init_buffer_size,char *init_buffer)

{
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,std::pmr::polymorphic_allocator<char>>
  local_40 [8];
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,std::pmr::polymorphic_allocator<char>>
  local_38 [8];
  size_type local_30;
  char *local_28;
  
  begin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
         *)(local_40 + 8));
  local_30 = init_buffer_size;
  local_28 = init_buffer;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,std::pmr::polymorphic_allocator<char>>
  ::
  emplace<iffl::flat_forward_list<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,std::pmr::polymorphic_allocator<char>>::push_front(unsigned_long,char_const*)::_lambda(_FLAT_FORWARD_LIST_TEST&,unsigned_long)_1_>
            (local_40,(iterator *)this,(size_type)(local_40 + 8),
             (anon_class_16_2_991d9809 *)init_buffer_size);
  return;
}

Assistant:

void push_front(size_type init_buffer_size, 
                    char const *init_buffer = nullptr) {
        emplace(begin(),
                init_buffer_size,
                [init_buffer_size, init_buffer](T &buffer,
                                                size_type element_size) {
                    FFL_CODDING_ERROR_IF_NOT(init_buffer_size == element_size);

                    if (init_buffer) {
                        copy_data(reinterpret_cast<char *>(&buffer), init_buffer, element_size);
                    } else {
                        zero_buffer(reinterpret_cast<char *>(&buffer), element_size);
                    }
                });
    }